

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

path * __thiscall ghc::filesystem::path::parent_path(path *__return_storage_ptr__,path *this)

{
  pointer pcVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last;
  ulong uVar5;
  ulong uVar6;
  iterator piter;
  char *local_88;
  const_iterator local_80;
  char *local_78;
  iterator local_70;
  
  uVar5 = (this->_path)._M_string_length;
  if (uVar5 < 3) {
    uVar3 = 0;
LAB_0011e21f:
    uVar6 = 0;
LAB_0011e221:
    if (uVar6 < uVar5) {
      uVar6 = (ulong)((this->_path)._M_dataplus._M_p[uVar6] == '/');
      goto LAB_0011e282;
    }
  }
  else {
    pcVar4 = (this->_path)._M_dataplus._M_p;
    if ((((*pcVar4 == '/') && (pcVar4[1] == '/')) && (pcVar4[2] != 0x2f)) &&
       (iVar2 = isprint((int)pcVar4[2]), iVar2 != 0)) {
      uVar3 = std::__cxx11::string::find((char)this,0x2f);
      uVar5 = (this->_path)._M_string_length;
      if (uVar3 == 0xffffffffffffffff) {
        uVar3 = uVar5;
      }
      if (uVar5 < 3) goto LAB_0011e21f;
    }
    else {
      uVar3 = 0;
    }
    pcVar4 = (this->_path)._M_dataplus._M_p;
    if (*pcVar4 == '/') {
      uVar6 = 1;
      if (((pcVar4[1] != '/') || (pcVar4[2] == 0x2f)) ||
         (iVar2 = isprint((int)pcVar4[2]), iVar2 == 0)) goto LAB_0011e282;
      uVar6 = std::__cxx11::string::find((char)this,0x2f);
      uVar5 = (this->_path)._M_string_length;
      if (uVar6 == 0xffffffffffffffff) {
        uVar6 = uVar5;
      }
      goto LAB_0011e221;
    }
  }
  uVar6 = 0;
LAB_0011e282:
  if (uVar3 + uVar6 < uVar5) {
    local_80._M_current = (this->_path)._M_dataplus._M_p + uVar5;
    iterator::iterator(&local_70,this,&local_80);
    pcVar4 = (this->_path)._M_dataplus._M_p + (this->_path)._M_string_length;
    last._M_current = pcVar4;
    if (((local_70._first._M_current != pcVar4) &&
        (last._M_current = pcVar4 + -1, last._M_current != local_70._root._M_current)) &&
       ((local_70._last._M_current != pcVar4 || (*last._M_current != '/')))) {
      local_78 = local_70._first._M_current;
      local_80._M_current = last._M_current;
      std::
      __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                (&local_88,&local_80,&local_78,&path_helper_base<char>::preferred_separator);
      last._M_current = local_88;
      if (((long)local_88 - (long)local_70._first._M_current == 2) &&
         (*local_70._first._M_current == '/')) {
        last._M_current = local_88 + (ulong)(local_70._first._M_current[1] != '/') * 2 + -2;
      }
    }
    first._M_current = (this->_path)._M_dataplus._M_p;
    if (first._M_current + uVar3 + uVar6 < last._M_current) {
      last._M_current = last._M_current + -(ulong)(*last._M_current != '/');
    }
    path<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              (__return_storage_ptr__,first,last,native_format);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._current._path._M_dataplus._M_p != &local_70._current._path.field_2) {
      operator_delete(local_70._current._path._M_dataplus._M_p);
    }
  }
  else {
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    pcVar1 = (this->_path)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + uVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::parent_path() const
{
    auto rootPathLen = _prefixLength + root_name_length() + (has_root_directory() ? 1 : 0);
    if (rootPathLen < _path.length()) {
        if (empty()) {
            return path();
        }
        else {
            auto piter = end();
            auto iter = piter.decrement(_path.end());
            if (iter > _path.begin() + static_cast<long>(rootPathLen) && *iter != preferred_separator) {
                --iter;
            }
            return path(_path.begin(), iter, native_format);
        }
    }
    else {
        return *this;
    }
}